

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::CreateDefaultGlobalGenerator(cmake *this)

{
  cmGlobalGenerator *gg;
  cmGlobalGenerator *in_RAX;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  cmGlobalGenerator *local_18;
  
  local_18 = in_RAX;
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffe8);
  gg = local_18;
  local_18 = (cmGlobalGenerator *)0x0;
  SetGlobalGenerator(this,gg);
  return;
}

Assistant:

void cmake::CreateDefaultGlobalGenerator()
{
  auto gen = this->EvaluateDefaultGlobalGenerator();
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
  // This print could be unified for all platforms
  std::cout << "-- Building for: " << gen->GetName() << "\n";
#endif
  this->SetGlobalGenerator(gen.release());
}